

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall GlobOptBlockData::CopyBlockData(GlobOptBlockData *this,GlobOptBlockData *fromData)

{
  ExprHashTable *pEVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  Func *pFVar3;
  InductionVariableSet *pIVar4;
  StackLiteralInitFldDataMap *pSVar5;
  uint uVar6;
  
  this->globOpt = fromData->globOpt;
  pEVar1 = fromData->exprToValueMap;
  this->symToValueMap = fromData->symToValueMap;
  this->exprToValueMap = pEVar1;
  pBVar2 = fromData->liveArrayValues;
  this->liveFields = fromData->liveFields;
  this->liveArrayValues = pBVar2;
  pBVar2 = fromData->isTempSrc;
  this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
  this->isTempSrc = pBVar2;
  pBVar2 = fromData->liveInt32Syms;
  this->liveVarSyms = fromData->liveVarSyms;
  this->liveInt32Syms = pBVar2;
  pBVar2 = fromData->liveFloat64Syms;
  this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
  this->liveFloat64Syms = pBVar2;
  pBVar2 = fromData->maybeTempObjectSyms;
  this->argObjSyms = fromData->argObjSyms;
  this->maybeTempObjectSyms = pBVar2;
  pFVar3 = fromData->curFunc;
  this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
  this->curFunc = pFVar3;
  pIVar4 = fromData->inductionVariables;
  this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
  this->inductionVariables = pIVar4;
  this->availableIntBoundChecks = fromData->availableIntBoundChecks;
  uVar6 = fromData->argOutCount;
  this->startCallCount = fromData->startCallCount;
  this->argOutCount = uVar6;
  this->totalOutParamCount = fromData->totalOutParamCount;
  this->inlinedArgOutSize = fromData->inlinedArgOutSize;
  this->hasCSECandidates = fromData->hasCSECandidates;
  pBVar2 = fromData->changedSyms;
  this->capturedValues = fromData->capturedValues;
  this->changedSyms = pBVar2;
  pSVar5 = fromData->stackLiteralInitFldDataMap;
  this->callSequence = fromData->callSequence;
  this->stackLiteralInitFldDataMap = pSVar5;
  this->hasDataRef = fromData->hasDataRef;
  return;
}

Assistant:

void
GlobOptBlockData::CopyBlockData(GlobOptBlockData *fromData)
{
    this->globOpt = fromData->globOpt;

    this->symToValueMap = fromData->symToValueMap;
    this->exprToValueMap = fromData->exprToValueMap;
    this->liveFields = fromData->liveFields;
    this->liveArrayValues = fromData->liveArrayValues;
    this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
    this->isTempSrc = fromData->isTempSrc;
    this->liveVarSyms = fromData->liveVarSyms;
    this->liveInt32Syms = fromData->liveInt32Syms;
    this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
    this->liveFloat64Syms = fromData->liveFloat64Syms;
    this->argObjSyms = fromData->argObjSyms;
    this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
    this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
    this->curFunc = fromData->curFunc;
    this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
    this->inductionVariables = fromData->inductionVariables;
    this->availableIntBoundChecks = fromData->availableIntBoundChecks;
    this->callSequence = fromData->callSequence;
    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    this->changedSyms = fromData->changedSyms;
    this->capturedValues = fromData->capturedValues;

    this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;
    this->OnDataReused(fromData);
}